

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O3

SymbolPairChecker * __thiscall
my_algorithm::SymbolPairChecker::operator=(SymbolPairChecker *this,SymbolPairChecker *checker)

{
  undefined8 *puVar1;
  long *plVar2;
  ListNode<char> *pLVar3;
  
  this->_cursor = checker->_cursor;
  std::__cxx11::string::_M_assign((string *)&this->_open_symbols);
  std::__cxx11::string::_M_assign((string *)&this->_close_symbols);
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR__ListNode_0010cd88;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 2) = 0;
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR__ListNode_0010cd88;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 2) = 0;
  plVar2 = (long *)operator_new(0x18);
  *plVar2 = (long)&PTR__ListNode_0010cd88;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  operator_delete(puVar1,0x18);
  pLVar3 = (ListNode<char> *)operator_new(0x18);
  pLVar3->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cd88;
  pLVar3->_next = (ListNode<char> *)0x0;
  pLVar3->element = '\0';
  (this->_stack)._list._header = pLVar3;
  (this->_stack)._list._tail = pLVar3;
  (this->_stack)._list._size = 0;
  (**(code **)(*plVar2 + 8))(plVar2);
  return this;
}

Assistant:

SymbolPairChecker& SymbolPairChecker::operator=(const SymbolPairChecker &checker) {
        _cursor = checker._cursor;
        _open_symbols = checker._open_symbols;
        _close_symbols = checker._close_symbols;
        _stack = data_structures::Stack<char>();
        return *this;
    }